

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Segment.cpp
# Opt level: O1

bool __thiscall pobr::imgProcessing::structs::Segment::isLetterC(Segment *this)

{
  byte bVar1;
  double dVar2;
  uint8_t local_3f [7];
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  double local_10;
  
  local_3f[6] = 1;
  local_10 = getHuMomentInvariant(this,local_3f + 6);
  local_3f[5] = 2;
  local_18 = getHuMomentInvariant(this,local_3f + 5);
  local_3f[4] = 3;
  local_20 = getHuMomentInvariant(this,local_3f + 4);
  local_3f[3] = 4;
  local_28 = getHuMomentInvariant(this,local_3f + 3);
  local_3f[2] = 5;
  local_30 = getHuMomentInvariant(this,local_3f + 2);
  local_3f[1] = 6;
  local_38 = getHuMomentInvariant(this,local_3f + 1);
  local_3f[0] = '\a';
  dVar2 = getHuMomentInvariant(this,local_3f);
  bVar1 = 0;
  if ((0.32875319999999997 <= local_10) && (bVar1 = 0, local_10 <= 0.6503290500000001)) {
    bVar1 = 0;
    if ((0.00033915 <= local_18) && (local_18 <= 0.13758150000000002)) {
      bVar1 = 0;
      if ((0.005281999999999999 <= local_20) && (local_20 <= 0.07366065)) {
        bVar1 = 0;
        if ((5.32e-05 <= local_28) && (local_28 <= 0.01238475)) {
          bVar1 = 0;
          if ((-0.0001953 <= local_30) && (local_30 <= 2.625e-05)) {
            bVar1 = 0;
            if ((-0.0022953 <= local_38) && (local_38 <= -7.695e-05)) {
              bVar1 = -(0.02773335 <= dVar2) & -(dVar2 <= 0.06630225000000001);
            }
          }
        }
      }
    }
  }
  return (bool)(bVar1 & 1);
}

Assistant:

const bool
Segment::isLetterC()
const
{
    const auto hu1 = this->getHuMomentInvariant(1);
    const auto hu2 = this->getHuMomentInvariant(2);
    const auto hu3 = this->getHuMomentInvariant(3);
    const auto hu4 = this->getHuMomentInvariant(4);
    const auto hu5 = this->getHuMomentInvariant(5);
    const auto hu6 = this->getHuMomentInvariant(6);
    const auto hu7 = this->getHuMomentInvariant(7);

    if (hu1 < 0.346056 * 0.95 || hu1 > 0.619361 * 1.05) {
        return false;
    }
    if (hu2 < 0.000357 * 0.95 || hu2 > 0.13103 * 1.05) {
        return false;
    }
    if (hu3 < 0.00556 * 0.95 || hu3 > 0.070153 * 1.05) {
        return false;
    }
    if (hu4 < 0.000056 * 0.95 || hu4 > 0.011795 * 1.05) {
        return false;
    }
    if (hu5 < -0.000186 * 1.05 || hu5 > 0.000025 * 1.05) {
        return false;
    }
    if (hu6 < -0.002186 * 1.05 || hu6 > -0.000081 * 0.95) {
        return false;
    }
    if (hu7 < 0.029193 * 0.95 || hu7 > 0.063145 * 1.05) {
        return false;
    }

    return true;
}